

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

bool __thiscall Json::Reader::readArray(Reader *this,Token *tokenStart)

{
  iterator *piVar1;
  ushort uVar2;
  Value *pVVar3;
  size_t sVar4;
  size_t sVar5;
  bool bVar6;
  int iVar7;
  char *pcVar8;
  _Elt_pointer ppVVar9;
  byte *pbVar10;
  ushort uVar11;
  int index;
  Token endArray;
  Token token;
  undefined1 local_90 [32];
  ValueHolder local_70;
  ushort local_68;
  undefined8 local_60;
  size_t sStack_58;
  size_t local_50;
  Token local_48;
  
  uVar11 = local_68 & 0xfe00;
  local_68 = uVar11 | 6;
  local_60 = 0;
  sStack_58 = 0;
  local_50 = 0;
  pcVar8 = (char *)operator_new(0x30);
  pcVar8[0x10] = '\0';
  pcVar8[0x11] = '\0';
  pcVar8[0x12] = '\0';
  pcVar8[0x13] = '\0';
  pcVar8[0x14] = '\0';
  pcVar8[0x15] = '\0';
  pcVar8[0x16] = '\0';
  pcVar8[0x17] = '\0';
  pcVar8[0x18] = '\0';
  pcVar8[0x19] = '\0';
  pcVar8[0x1a] = '\0';
  pcVar8[0x1b] = '\0';
  pcVar8[0x1c] = '\0';
  pcVar8[0x1d] = '\0';
  pcVar8[0x1e] = '\0';
  pcVar8[0x1f] = '\0';
  pcVar8[0x20] = '\0';
  pcVar8[0x21] = '\0';
  pcVar8[0x22] = '\0';
  pcVar8[0x23] = '\0';
  pcVar8[0x24] = '\0';
  pcVar8[0x25] = '\0';
  pcVar8[0x26] = '\0';
  pcVar8[0x27] = '\0';
  pcVar8[0x28] = '\0';
  pcVar8[0x29] = '\0';
  pcVar8[0x2a] = '\0';
  pcVar8[0x2b] = '\0';
  pcVar8[0x2c] = '\0';
  pcVar8[0x2d] = '\0';
  pcVar8[0x2e] = '\0';
  pcVar8[0x2f] = '\0';
  pcVar8[0] = '\0';
  pcVar8[1] = '\0';
  pcVar8[2] = '\0';
  pcVar8[3] = '\0';
  pcVar8[4] = '\0';
  pcVar8[5] = '\0';
  pcVar8[6] = '\0';
  pcVar8[7] = '\0';
  pcVar8[8] = '\0';
  pcVar8[9] = '\0';
  pcVar8[10] = '\0';
  pcVar8[0xb] = '\0';
  pcVar8[0xc] = '\0';
  pcVar8[0xd] = '\0';
  pcVar8[0xe] = '\0';
  pcVar8[0xf] = '\0';
  *(char **)(pcVar8 + 0x18) = pcVar8 + 8;
  *(char **)(pcVar8 + 0x20) = pcVar8 + 8;
  pcVar8[0x28] = '\0';
  pcVar8[0x29] = '\0';
  pcVar8[0x2a] = '\0';
  pcVar8[0x2b] = '\0';
  pcVar8[0x2c] = '\0';
  pcVar8[0x2d] = '\0';
  pcVar8[0x2e] = '\0';
  pcVar8[0x2f] = '\0';
  ppVVar9 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar9 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar9 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  pVVar3 = ppVVar9[-1];
  uVar2 = *(ushort *)&pVVar3->field_0x8;
  *(ushort *)&pVVar3->field_0x8 = uVar2 & 0xff00 | 6;
  local_70.map_ = *(ObjectValues **)&pVVar3->value_;
  (pVVar3->value_).string_ = pcVar8;
  *(ushort *)&pVVar3->field_0x8 = uVar2 & 0xfe00 | 6;
  local_68 = uVar2 & 0x100 | uVar11 | uVar2 & 0xff;
  sVar4 = pVVar3->start_;
  sVar5 = pVVar3->limit_;
  pVVar3->start_ = sStack_58;
  pVVar3->limit_ = local_50;
  sStack_58 = sVar4;
  local_50 = sVar5;
  Value::~Value((Value *)&local_70);
  ppVVar9 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar9 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar9 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  ppVVar9[-1]->start_ = (long)tokenStart->start_ - (long)this->begin_;
  pbVar10 = (byte *)this->current_;
  while (((pbVar10 != (byte *)this->end_ && ((ulong)*pbVar10 < 0x21)) &&
         ((0x100002600U >> ((ulong)*pbVar10 & 0x3f) & 1) != 0))) {
    pbVar10 = pbVar10 + 1;
    this->current_ = (Location)pbVar10;
  }
  if (*this->current_ == ']') {
    readToken(this,(Token *)local_90);
  }
  else {
    index = 0;
    do {
      ppVVar9 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (ppVVar9 ==
          (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_first) {
        ppVVar9 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      local_90._0_8_ = Value::operator[](ppVVar9[-1],index);
      ppVVar9 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (ppVVar9 ==
          (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<Json::Value*,std::allocator<Json::Value*>>::_M_push_back_aux<Json::Value*>
                  ((deque<Json::Value*,std::allocator<Json::Value*>> *)this,(Value **)local_90);
      }
      else {
        *ppVVar9 = (Value *)local_90._0_8_;
        piVar1 = &(this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish;
        piVar1->_M_cur = piVar1->_M_cur + 1;
      }
      bVar6 = readValue(this);
      std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>::pop_back
                ((deque<Json::Value_*,_std::allocator<Json::Value_*>_> *)this);
      if (bVar6) {
        do {
          readToken(this,&local_48);
        } while (local_48.type_ == tokenComment);
        if (local_48.type_ == tokenArrayEnd) {
          iVar7 = 2;
        }
        else {
          if (local_48.type_ != tokenArraySeparator) {
            local_90._0_8_ = local_90 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_90,"Missing \',\' or \']\' in array declaration","");
            addError(this,(string *)local_90,&local_48,(Location)0x0);
            recoverFromError(this,tokenArrayEnd);
            if ((Value *)local_90._0_8_ != (Value *)(local_90 + 0x10)) {
              operator_delete((void *)local_90._0_8_);
            }
            goto LAB_0010d3c9;
          }
          iVar7 = 0;
        }
      }
      else {
        recoverFromError(this,tokenArrayEnd);
LAB_0010d3c9:
        iVar7 = 1;
      }
      index = index + 1;
    } while (iVar7 == 0);
    if (iVar7 != 2) {
      return false;
    }
  }
  return true;
}

Assistant:

bool Reader::readArray(Token& tokenStart) {
  currentValue() = Value(arrayValue);
  currentValue().setOffsetStart(tokenStart.start_ - begin_);
  skipSpaces();
  if (*current_ == ']') // empty array
  {
    Token endArray;
    readToken(endArray);
    return true;
  }
  int index = 0;
  for (;;) {
    Value& value = currentValue()[index++];
    nodes_.push(&value);
    bool ok = readValue();
    nodes_.pop();
    if (!ok) // error already set
      return recoverFromError(tokenArrayEnd);

    Token token;
    // Accept Comment after last item in the array.
    ok = readToken(token);
    while (token.type_ == tokenComment && ok) {
      ok = readToken(token);
    }
    bool badTokenType =
        (token.type_ != tokenArraySeparator && token.type_ != tokenArrayEnd);
    if (!ok || badTokenType) {
      return addErrorAndRecover(
          "Missing ',' or ']' in array declaration", token, tokenArrayEnd);
    }
    if (token.type_ == tokenArrayEnd)
      break;
  }
  return true;
}